

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_tree.h
# Opt level: O0

size_t dicroce::blob_tree::_sizeof_treeb(blob_tree *rt)

{
  bool bVar1;
  reference ppVar2;
  long lVar3;
  size_t sVar4;
  reference rt_00;
  blob_tree *c;
  const_iterator __end4;
  const_iterator __begin4;
  vector<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_> *__range4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>
  *cp;
  const_iterator __end3;
  const_iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
  *__range3;
  size_t sum;
  blob_tree *rt_local;
  
  __range3 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
              *)0x5;
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
          ::empty(&rt->_children);
  if (bVar1) {
    bVar1 = std::vector<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>::empty
                      (&rt->_childrenByIndex);
    if (bVar1) {
      __range3 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
                  *)((rt->_payload).first + 9);
    }
    else {
      __end4 = std::vector<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>::begin
                         (&rt->_childrenByIndex);
      c = (blob_tree *)
          std::vector<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>::end
                    (&rt->_childrenByIndex);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_dicroce::blob_tree_*,_std::vector<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>_>
                                         *)&c), bVar1) {
        rt_00 = __gnu_cxx::
                __normal_iterator<const_dicroce::blob_tree_*,_std::vector<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>_>
                ::operator*(&__end4);
        sVar4 = _sizeof_treeb(rt_00);
        __range3 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
                    *)(&(__range3->_M_t)._M_impl.field_0x0 + sVar4);
        __gnu_cxx::
        __normal_iterator<const_dicroce::blob_tree_*,_std::vector<dicroce::blob_tree,_std::allocator<dicroce::blob_tree>_>_>
        ::operator++(&__end4);
      }
    }
  }
  else {
    __end3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
             ::begin(&rt->_children);
    cp = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
            ::end(&rt->_children);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&cp), bVar1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>
               ::operator*(&__end3);
      lVar3 = std::__cxx11::string::length();
      sVar4 = _sizeof_treeb(&ppVar2->second);
      __range3 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>_>
                  *)(&(__range3->_M_t)._M_impl.field_0x2 + lVar3 + sVar4);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dicroce::blob_tree>_>
      ::operator++(&__end3);
    }
  }
  return (size_t)__range3;
}

Assistant:

static size_t _sizeof_treeb(const blob_tree& rt)
    {
        size_t sum = 1 + sizeof(uint32_t); // type & num children

        if(!rt._children.empty())
        {
            for(auto& cp : rt._children)
                sum += sizeof(uint16_t) + cp.first.length() + _sizeof_treeb(cp.second);
        }
        else if(!rt._childrenByIndex.empty())
        {
            for(auto& c : rt._childrenByIndex)
                sum += _sizeof_treeb(c);
        }
        else sum += sizeof(uint32_t) + rt._payload.first;

        return sum;
    }